

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::ElementInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::shiftUp(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::ElementInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,size_t startIdx,size_t insertion_idx)

{
  size_t sVar1;
  size_t sVar2;
  size_t local_28;
  size_t idx;
  size_t insertion_idx_local;
  size_t startIdx_local;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::ElementInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  DataNode<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::ElementInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
  ::DataNode(this->mKeyVals + startIdx,this->mKeyVals + (startIdx - 1));
  local_28 = startIdx;
  while (sVar2 = local_28 - 1, sVar1 = startIdx, sVar2 != insertion_idx) {
    DataNode<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::ElementInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
    ::operator=(this->mKeyVals + sVar2,this->mKeyVals + (local_28 - 2));
    local_28 = sVar2;
  }
  while (local_28 = sVar1, local_28 != insertion_idx) {
    this->mInfo[local_28] = this->mInfo[local_28 - 1] + (char)this->mInfoInc;
    if (0xff < (uint)this->mInfo[local_28] + this->mInfoInc) {
      this->mMaxNumElementsAllowed = 0;
    }
    sVar1 = local_28 - 1;
  }
  return;
}

Assistant:

void
    shiftUp(size_t startIdx,
            size_t const insertion_idx) noexcept(std::is_nothrow_move_assignable<Node>::value) {
        auto idx = startIdx;
        ::new (static_cast<void*>(mKeyVals + idx)) Node(std::move(mKeyVals[idx - 1]));
        while (--idx != insertion_idx) {
            mKeyVals[idx] = std::move(mKeyVals[idx - 1]);
        }

        idx = startIdx;
        while (idx != insertion_idx) {
            ROBIN_HOOD_COUNT(shiftUp)
            mInfo[idx] = static_cast<uint8_t>(mInfo[idx - 1] + mInfoInc);
            if (ROBIN_HOOD_UNLIKELY(mInfo[idx] + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }
            --idx;
        }
    }